

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::inheritStyle(QWidgetPrivate *this)

{
  QWidget *w;
  QWExtra *pQVar1;
  QStyleSheetStyle *pQVar2;
  long lVar3;
  QStyleSheetStyle *base;
  QStyleSheetStyle *pQVar4;
  QArrayData *pQVar5;
  long in_FS_OFFSET;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  w = *(QWidget **)&this->field_0x8;
  pQVar1 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (((pQVar1 == (QWExtra *)0x0) || (lVar3 = (long)(pQVar1->style).wp.d, lVar3 == 0)) ||
     (*(int *)(lVar3 + 4) == 0)) {
    pQVar4 = (QStyleSheetStyle *)0x0;
  }
  else {
    pQVar4 = *(QStyleSheetStyle **)((long)&(pQVar1->style).wp + 8);
  }
  pQVar2 = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
  lVar3 = *(long *)(*(long *)&w->field_0x8 + 0x78);
  if (lVar3 == 0) {
    pQVar5 = (QArrayData *)0x0;
    lVar3 = 0;
  }
  else {
    pQVar5 = *(QArrayData **)(lVar3 + 0x48);
    lVar3 = *(long *)(lVar3 + 0x58);
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (lVar3 != 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QStyleSheetStyle::repolish(pQVar2,w);
      return;
    }
    goto LAB_002fef22;
  }
  base = pQVar4;
  if (pQVar2 != (QStyleSheetStyle *)0x0) {
    base = *(QStyleSheetStyle **)(pQVar2 + 0x10);
  }
  lVar3 = *(long *)(*(long *)&w->field_0x8 + 0x10);
  if (((lVar3 == 0) || (lVar3 = *(long *)(*(long *)(lVar3 + 8) + 0x78), lVar3 == 0)) ||
     ((*(long *)(lVar3 + 0x20) == 0 || (*(int *)(*(long *)(lVar3 + 0x20) + 4) == 0)))) {
    pQVar2 = (QStyleSheetStyle *)0x0;
  }
  else {
    pQVar2 = *(QStyleSheetStyle **)(lVar3 + 0x28);
  }
  QApplication::styleSheet(&local_50,QCoreApplication::self);
  if (local_50.d.size == 0) {
    lVar3 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (lVar3 != 0) goto LAB_002fee68;
    if (base != pQVar4) {
      if ((*(uint *)(*(long *)&w->field_0x8 + 0x244) >> 0x16 & 1) == 0) {
        base = (QStyleSheetStyle *)0x0;
      }
      goto LAB_002feeda;
    }
  }
  else {
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_002fee68:
    if (((*(byte *)(*(long *)&w->field_0x8 + 0x246) & 0x40) == 0) ||
       (lVar3 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject), lVar3 != 0)) {
      base = (QStyleSheetStyle *)QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject);
      if ((base == (QStyleSheetStyle *)0x0) &&
         (lVar3 = QMetaObject::cast((QObject *)&QStyleSheetStyle::staticMetaObject), base = pQVar2,
         lVar3 != 0)) {
        *(int *)(lVar3 + 0x18) = *(int *)(lVar3 + 0x18) + 1;
      }
    }
    else {
      pQVar4 = (QStyleSheetStyle *)operator_new(0x60);
      QStyleSheetStyle::QStyleSheetStyle(pQVar4,(QStyle *)base);
      base = pQVar4;
    }
LAB_002feeda:
    setStyle_helper(this,(QStyle *)base,true);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_002fef22:
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::inheritStyle()
{
#ifndef QT_NO_STYLE_STYLESHEET
    Q_Q(QWidget);

    QStyle *extraStyle = extra ? (QStyle*)extra->style : nullptr;

    QStyleSheetStyle *proxy = qt_styleSheet(extraStyle);

    if (!q->styleSheet().isEmpty()) {
        Q_ASSERT(proxy);
        proxy->repolish(q);
        return;
    }

    QStyle *origStyle = proxy ? proxy->base : extraStyle;
    QWidget *parent = q->parentWidget();
    QStyle *parentStyle = (parent && parent->d_func()->extra) ? (QStyle*)parent->d_func()->extra->style : nullptr;
    // If we have stylesheet on app or parent has stylesheet style, we need
    // to be running a proxy
    if (!qApp->styleSheet().isEmpty() || qt_styleSheet(parentStyle)) {
        QStyle *newStyle = parentStyle;
        if (q->testAttribute(Qt::WA_SetStyle) && qt_styleSheet(origStyle) == nullptr)
            newStyle = new QStyleSheetStyle(origStyle);
        else if (auto *styleSheetStyle = qt_styleSheet(origStyle))
            newStyle = styleSheetStyle;
        else if (QStyleSheetStyle *newProxy = qt_styleSheet(parentStyle))
            newProxy->ref();

        setStyle_helper(newStyle, true);
        return;
    }

    // So, we have no stylesheet on parent/app and we have an empty stylesheet
    // we just need our original style back
    if (origStyle == extraStyle) // is it any different?
        return;

    // We could have inherited the proxy from our parent (which has a custom style)
    // In such a case we need to start following the application style (i.e revert
    // the propagation behavior of QStyleSheetStyle)
    if (!q->testAttribute(Qt::WA_SetStyle))
        origStyle = nullptr;

    setStyle_helper(origStyle, true);
#endif // QT_NO_STYLE_STYLESHEET
}